

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

MMDB_entry_data_list_s *
dump_entry_data_list(FILE *stream,MMDB_entry_data_list_s *entry_data_list,int indent,int *status)

{
  uint uVar1;
  void *__ptr;
  MMDB_entry_data_list_s *entry_data_list_00;
  uint32_t uVar2;
  byte *pbVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  char *pcVar8;
  
  iVar5 = 7;
  entry_data_list_00 = (MMDB_entry_data_list_s *)0x0;
  switch((entry_data_list->entry_data).type) {
  case 2:
    pcVar8 = mmdb_strndup((entry_data_list->entry_data).field_1.utf8_string,
                          (ulong)(entry_data_list->entry_data).data_size);
    entry_data_list_00 = (MMDB_entry_data_list_s *)0x0;
    if (pcVar8 == (char *)0x0) {
      iVar5 = 5;
      goto switchD_00102e30_caseD_c;
    }
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"\"%s\" <utf8_string>\n",pcVar8);
    free(pcVar8);
    goto LAB_00103007;
  case 3:
    print_indentation(stream,indent);
    pcVar8 = (entry_data_list->entry_data).field_1.utf8_string;
    pcVar4 = "%f <double>\n";
    goto LAB_00102ffd;
  case 4:
    pbVar3 = (entry_data_list->entry_data).field_1.bytes;
    uVar1 = (entry_data_list->entry_data).data_size;
    __ptr = calloc((ulong)(uVar1 * 2 + 1),1);
    if (__ptr == (void *)0x0) {
LAB_00103161:
      iVar5 = 5;
LAB_00103165:
      entry_data_list_00 = (MMDB_entry_data_list_s *)0x0;
    }
    else {
      for (uVar6 = 0; (ulong)uVar1 * 2 != uVar6; uVar6 = uVar6 + 2) {
        sprintf((char *)((uVar6 & 0xffffffff) + (long)__ptr),"%02X",(ulong)*pbVar3);
        pbVar3 = pbVar3 + 1;
      }
      print_indentation(stream,indent);
      iVar5 = 0;
      fprintf((FILE *)stream,"%s <bytes>\n",__ptr);
      free(__ptr);
      entry_data_list_00 = entry_data_list->next;
    }
    goto switchD_00102e30_caseD_c;
  case 5:
    print_indentation(stream,indent);
    uVar6 = (ulong)(entry_data_list->entry_data).field_1.uint16;
    pcVar8 = "%u <uint16>\n";
    break;
  case 6:
    print_indentation(stream,indent);
    uVar6 = (ulong)(entry_data_list->entry_data).field_1.pointer;
    pcVar8 = "%u <uint32>\n";
    break;
  case 7:
    uVar2 = (entry_data_list->entry_data).data_size;
    print_indentation(stream,indent);
    fwrite("{\n",2,1,(FILE *)stream);
    entry_data_list_00 = entry_data_list->next;
    while ((bVar7 = uVar2 != 0, uVar2 = uVar2 - 1, bVar7 &&
           (entry_data_list_00 != (MMDB_entry_data_list_s *)0x0))) {
      if ((entry_data_list_00->entry_data).type != 2) goto LAB_00103165;
      pcVar8 = mmdb_strndup((entry_data_list_00->entry_data).field_1.utf8_string,
                            (ulong)(entry_data_list_00->entry_data).data_size);
      if (pcVar8 == (char *)0x0) goto LAB_00103161;
      print_indentation(stream,indent + 2);
      fprintf((FILE *)stream,"\"%s\": \n",pcVar8);
      free(pcVar8);
      entry_data_list_00 = dump_entry_data_list(stream,entry_data_list_00->next,indent + 4,status);
      if (*status != 0) {
        return (MMDB_entry_data_list_s *)0x0;
      }
    }
    print_indentation(stream,indent);
    pcVar8 = "}\n";
    goto LAB_0010319a;
  case 8:
    print_indentation(stream,indent);
    uVar6 = (ulong)(entry_data_list->entry_data).field_1.pointer;
    pcVar8 = "%d <int32>\n";
    break;
  case 9:
    print_indentation(stream,indent);
    pcVar8 = (entry_data_list->entry_data).field_1.utf8_string;
    pcVar4 = "%lu <uint64>\n";
    goto LAB_0010303c;
  case 10:
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"0x%016lX%016lX <uint128>\n",
            *(undefined8 *)((long)&(entry_data_list->entry_data).field_1 + 8),
            (entry_data_list->entry_data).field_1.utf8_string);
    goto LAB_00103121;
  case 0xb:
    uVar2 = (entry_data_list->entry_data).data_size;
    print_indentation(stream,indent);
    fwrite("[\n",2,1,(FILE *)stream);
    entry_data_list_00 = entry_data_list->next;
    while ((bVar7 = uVar2 != 0, uVar2 = uVar2 - 1, bVar7 &&
           (entry_data_list_00 != (MMDB_entry_data_list_s *)0x0))) {
      entry_data_list_00 = dump_entry_data_list(stream,entry_data_list_00,indent + 2,status);
      if (*status != 0) {
        return (MMDB_entry_data_list_s *)0x0;
      }
    }
    print_indentation(stream,indent);
    pcVar8 = "]\n";
LAB_0010319a:
    fwrite(pcVar8,2,1,(FILE *)stream);
    goto LAB_001031a8;
  default:
    goto switchD_00102e30_caseD_c;
  case 0xe:
    print_indentation(stream,indent);
    pcVar8 = "false";
    if ((entry_data_list->entry_data).field_1.boolean != false) {
      pcVar8 = "true";
    }
    pcVar4 = "%s <boolean>\n";
LAB_0010303c:
    fprintf((FILE *)stream,pcVar4,pcVar8);
    goto LAB_00103121;
  case 0xf:
    print_indentation(stream,indent);
    pcVar8 = (char *)(double)(entry_data_list->entry_data).field_1.float_value;
    pcVar4 = "%f <float>\n";
LAB_00102ffd:
    fprintf((FILE *)stream,pcVar4,pcVar8);
LAB_00103007:
    entry_data_list_00 = entry_data_list->next;
LAB_001031a8:
    iVar5 = 0;
    goto switchD_00102e30_caseD_c;
  }
  fprintf((FILE *)stream,pcVar8,uVar6);
LAB_00103121:
  iVar5 = 0;
  entry_data_list_00 = entry_data_list->next;
switchD_00102e30_caseD_c:
  *status = iVar5;
  return entry_data_list_00;
}

Assistant:

static MMDB_entry_data_list_s *
dump_entry_data_list(FILE *stream,
                     MMDB_entry_data_list_s *entry_data_list,
                     int indent,
                     int *status) {
    switch (entry_data_list->entry_data.type) {
        case MMDB_DATA_TYPE_MAP: {
            uint32_t size = entry_data_list->entry_data.data_size;

            print_indentation(stream, indent);
            fprintf(stream, "{\n");
            indent += 2;

            for (entry_data_list = entry_data_list->next;
                 size && entry_data_list;
                 size--) {

                if (MMDB_DATA_TYPE_UTF8_STRING !=
                    entry_data_list->entry_data.type) {
                    *status = MMDB_INVALID_DATA_ERROR;
                    return NULL;
                }
                char *key =
                    mmdb_strndup(entry_data_list->entry_data.utf8_string,
                                 entry_data_list->entry_data.data_size);
                if (NULL == key) {
                    *status = MMDB_OUT_OF_MEMORY_ERROR;
                    return NULL;
                }

                print_indentation(stream, indent);
                fprintf(stream, "\"%s\": \n", key);
                free(key);

                entry_data_list = entry_data_list->next;
                entry_data_list = dump_entry_data_list(
                    stream, entry_data_list, indent + 2, status);

                if (MMDB_SUCCESS != *status) {
                    return NULL;
                }
            }

            indent -= 2;
            print_indentation(stream, indent);
            fprintf(stream, "}\n");
        } break;
        case MMDB_DATA_TYPE_ARRAY: {
            uint32_t size = entry_data_list->entry_data.data_size;

            print_indentation(stream, indent);
            fprintf(stream, "[\n");
            indent += 2;

            for (entry_data_list = entry_data_list->next;
                 size && entry_data_list;
                 size--) {
                entry_data_list = dump_entry_data_list(
                    stream, entry_data_list, indent, status);
                if (MMDB_SUCCESS != *status) {
                    return NULL;
                }
            }

            indent -= 2;
            print_indentation(stream, indent);
            fprintf(stream, "]\n");
        } break;
        case MMDB_DATA_TYPE_UTF8_STRING: {
            char *string = mmdb_strndup(entry_data_list->entry_data.utf8_string,
                                        entry_data_list->entry_data.data_size);
            if (NULL == string) {
                *status = MMDB_OUT_OF_MEMORY_ERROR;
                return NULL;
            }
            print_indentation(stream, indent);
            fprintf(stream, "\"%s\" <utf8_string>\n", string);
            free(string);
            entry_data_list = entry_data_list->next;
        } break;
        case MMDB_DATA_TYPE_BYTES: {
            char *hex_string =
                bytes_to_hex(entry_data_list->entry_data.bytes,
                             entry_data_list->entry_data.data_size);

            if (NULL == hex_string) {
                *status = MMDB_OUT_OF_MEMORY_ERROR;
                return NULL;
            }

            print_indentation(stream, indent);
            fprintf(stream, "%s <bytes>\n", hex_string);
            free(hex_string);

            entry_data_list = entry_data_list->next;
        } break;
        case MMDB_DATA_TYPE_DOUBLE:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%f <double>\n",
                    entry_data_list->entry_data.double_value);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_FLOAT:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%f <float>\n",
                    entry_data_list->entry_data.float_value);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT16:
            print_indentation(stream, indent);
            fprintf(
                stream, "%u <uint16>\n", entry_data_list->entry_data.uint16);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT32:
            print_indentation(stream, indent);
            fprintf(
                stream, "%u <uint32>\n", entry_data_list->entry_data.uint32);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_BOOLEAN:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%s <boolean>\n",
                    entry_data_list->entry_data.boolean ? "true" : "false");
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT64:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%" PRIu64 " <uint64>\n",
                    entry_data_list->entry_data.uint64);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT128:
            print_indentation(stream, indent);
#if MMDB_UINT128_IS_BYTE_ARRAY
            char *hex_string = bytes_to_hex(
                (uint8_t *)entry_data_list->entry_data.uint128, 16);
            if (NULL == hex_string) {
                *status = MMDB_OUT_OF_MEMORY_ERROR;
                return NULL;
            }
            fprintf(stream, "0x%s <uint128>\n", hex_string);
            free(hex_string);
#else
            uint64_t high = entry_data_list->entry_data.uint128 >> 64;
            uint64_t low = (uint64_t)entry_data_list->entry_data.uint128;
            fprintf(stream,
                    "0x%016" PRIX64 "%016" PRIX64 " <uint128>\n",
                    high,
                    low);
#endif
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_INT32:
            print_indentation(stream, indent);
            fprintf(stream, "%d <int32>\n", entry_data_list->entry_data.int32);
            entry_data_list = entry_data_list->next;
            break;
        default:
            *status = MMDB_INVALID_DATA_ERROR;
            return NULL;
    }

    *status = MMDB_SUCCESS;
    return entry_data_list;
}